

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verify<char[12],int>(char (*contents) [12],Options *options)

{
  uchar *in_RCX;
  size_t siglen;
  size_t in_R8;
  string local_30;
  
  StringMaker::toString<char[12]>(&local_30,contents);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
            ((EVP_PKEY_CTX *)&local_30,(uchar *)options,siglen,in_RCX,in_R8);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

static void verify(const T& contents, const Options& options = Options())
        {
            verify(TCompileTimeOptions::ToStringConverter::toString(contents), options);
        }